

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::Equals,bool,false,true>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  unsigned_long *puVar5;
  ulong uVar6;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  bool bVar19;
  ulong idx;
  ulong uVar20;
  char **ppcVar21;
  ulong uVar22;
  idx_t idx_00;
  ulong idx_01;
  ulong uVar23;
  string_t left;
  string_t left_00;
  string_t left_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar21 = &(ldata->value).pointer.ptr;
    for (idx_00 = 0; count != idx_00; idx_00 = idx_00 + 1) {
      paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar21 + -1);
      uVar4 = paVar1->length;
      uVar9 = paVar1->prefix[0];
      uVar12 = paVar1->prefix[1];
      uVar15 = paVar1->prefix[2];
      uVar18 = paVar1->prefix[3];
      left_01.value.pointer.prefix[3] = uVar18;
      left_01.value.pointer.prefix[2] = uVar15;
      left_01.value.pointer.prefix[1] = uVar12;
      left_01.value.pointer.prefix[0] = uVar9;
      left_01.value.pointer.length = uVar4;
      left_01.value.pointer.ptr = *ppcVar21;
      bVar19 = BinarySingleArgumentOperatorWrapper::
               Operation<bool,duckdb::Equals,duckdb::string_t,duckdb::string_t,bool>
                         (fun,left_01,(string_t)(rdata->value).pointer,mask,idx_00);
      result_data[idx_00] = bVar19;
      ppcVar21 = ppcVar21 + 2;
    }
  }
  else {
    idx_01 = 0;
    for (uVar20 = 0; uVar20 != count + 0x3f >> 6; uVar20 = uVar20 + 1) {
      puVar5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        uVar23 = idx_01 + 0x40;
        if (count <= idx_01 + 0x40) {
          uVar23 = count;
        }
LAB_017521d4:
        ppcVar21 = &ldata[idx_01].value.pointer.ptr;
        for (; idx = idx_01, idx_01 < uVar23; idx_01 = idx_01 + 1) {
          paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar21 + -1);
          uVar2 = paVar1->length;
          uVar7 = paVar1->prefix[0];
          uVar10 = paVar1->prefix[1];
          uVar13 = paVar1->prefix[2];
          uVar16 = paVar1->prefix[3];
          left.value.pointer.prefix[3] = uVar16;
          left.value.pointer.prefix[2] = uVar13;
          left.value.pointer.prefix[1] = uVar10;
          left.value.pointer.prefix[0] = uVar7;
          left.value.pointer.length = uVar2;
          left.value.pointer.ptr = *ppcVar21;
          bVar19 = BinarySingleArgumentOperatorWrapper::
                   Operation<bool,duckdb::Equals,duckdb::string_t,duckdb::string_t,bool>
                             (fun,left,(string_t)(rdata->value).pointer,mask,idx_01);
          result_data[idx_01] = bVar19;
          ppcVar21 = ppcVar21 + 2;
        }
      }
      else {
        uVar6 = puVar5[uVar20];
        uVar23 = idx_01 + 0x40;
        if (count <= idx_01 + 0x40) {
          uVar23 = count;
        }
        if (uVar6 == 0xffffffffffffffff) goto LAB_017521d4;
        idx = uVar23;
        if (uVar6 != 0) {
          ppcVar21 = &ldata[idx_01].value.pointer.ptr;
          for (uVar22 = 0; idx = uVar22 + idx_01, idx < uVar23; uVar22 = uVar22 + 1) {
            if ((uVar6 >> (uVar22 & 0x3f) & 1) != 0) {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar21 + -1);
              uVar3 = paVar1->length;
              uVar8 = paVar1->prefix[0];
              uVar11 = paVar1->prefix[1];
              uVar14 = paVar1->prefix[2];
              uVar17 = paVar1->prefix[3];
              left_00.value.pointer.prefix[3] = uVar17;
              left_00.value.pointer.prefix[2] = uVar14;
              left_00.value.pointer.prefix[1] = uVar11;
              left_00.value.pointer.prefix[0] = uVar8;
              left_00.value.pointer.length = uVar3;
              left_00.value.pointer.ptr = *ppcVar21;
              bVar19 = BinarySingleArgumentOperatorWrapper::
                       Operation<bool,duckdb::Equals,duckdb::string_t,duckdb::string_t,bool>
                                 (fun,left_00,(string_t)(rdata->value).pointer,mask,idx);
              result_data[uVar22 + idx_01] = bVar19;
            }
            ppcVar21 = ppcVar21 + 2;
          }
        }
      }
      idx_01 = idx;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}